

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uintptr_t o;
  TCGTemp *pTVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  TCGTemp *pTVar10;
  uint uVar11;
  uintptr_t o_59;
  TCGArg TVar12;
  ulong uVar13;
  TCGContext_conflict1 *pTVar14;
  uint uVar15;
  DisasContext_conflict1 *pDVar16;
  code *pcVar17;
  uint64_t pc;
  DisasContext_conflict1 *s_00;
  uint32_t target_el;
  uintptr_t o_7;
  TCGv_i64 pTVar18;
  long lVar19;
  TCGv_i32 pTVar20;
  uintptr_t o_5;
  TCGArg TVar21;
  uint uVar22;
  uintptr_t o_6;
  ulong uVar23;
  TCGv_i32 pTVar24;
  uint rn;
  TCGv_i32 tcg_res [8];
  int in_stack_fffffffffffffe48;
  TCGTemp *pTStack_1b0;
  TCGv_i64 pTStack_1a8;
  long lStack_1a0;
  TCGContext_conflict1 *pTStack_198;
  TCGv_i64 pTStack_190;
  TCGv_i64 pTStack_188;
  TCGArg TStack_180;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  TCGv_i32 pTStack_160;
  DisasContext_conflict1 *pDStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  TCGArg TStack_138;
  long lStack_130;
  TCGTemp *pTStack_128;
  TCGv_i32 pTStack_120;
  TCGContext_conflict1 *pTStack_118;
  DisasContext_conflict1 *pDStack_110;
  TCGContext_conflict1 *local_108;
  TCGTemp *local_100;
  TCGTemp *local_f8;
  TCGTemp *local_f0;
  TCGTemp *local_e8;
  long local_e0;
  TCGTemp *local_d8;
  TCGTemp *local_d0;
  DisasContext_conflict1 *local_a8;
  uint local_9c;
  TCGTemp *local_98;
  TCGTemp *local_90;
  TCGv_i64 local_88;
  TCGv_i64 local_80;
  ulong local_78;
  uint32_t local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint local_48;
  uint local_44;
  TCGv_i64 local_40;
  ulong local_38;
  
  if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    pDStack_110 = (DisasContext_conflict1 *)0x6b0555;
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  pTVar14 = s->uc->tcg_ctx;
  s->fp_access_checked = true;
  local_108 = pTVar14;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_60 = (ulong)(insn >> 0x10 & 0x1f);
  local_68 = (ulong)(insn >> 5 & 0x1f);
  local_9c = insn & 0x1f;
  uVar15 = insn >> 0x14 & 8 | insn >> 0xb & 7;
  uVar11 = insn >> 0x19 & 0x10;
  uVar22 = insn >> 0x1c & 4;
  uVar7 = (uVar11 + uVar15) - 0x10;
  uVar8 = uVar7 >> 1;
  local_48 = uVar8 | (uint)((uVar7 & 1) != 0) << 0x1f;
  uVar7 = uVar22 + 4;
  local_f8 = (TCGTemp *)CONCAT71(local_f8._1_7_,local_48 < 8);
  local_f0 = (TCGTemp *)CONCAT71(local_f0._1_7_,0x9b >> ((byte)uVar8 & 0x1f));
  uVar8 = 0;
  pDStack_110 = (DisasContext_conflict1 *)0x6afb95;
  local_a8 = s;
  local_6c = insn;
  pTVar6 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I64,false);
  pTVar18 = (TCGv_i64)((long)pTVar6 - (long)pTVar14);
  pDStack_110 = (DisasContext_conflict1 *)0x6afbb2;
  tcg_gen_addi_i64_aarch64(pTVar14,pTVar18,(TCGv_i64)pTVar14->cpu_env,0x2ed0);
  pTVar14 = local_108;
  local_40 = pTVar18;
  if (((byte)local_f8 & (byte)local_f0) == 0) {
    local_58 = (ulong)(uVar15 | uVar11);
    local_100 = (TCGTemp *)((long)local_108 + (long)pTVar18);
    local_f8 = (TCGTemp *)(ulong)(local_9c * 0x100 + 0xc10);
    pTVar6 = (TCGTemp *)(ulong)uVar7;
    TVar12 = (ulong)(uint)((int)local_60 << 8) + 0xc10;
    TVar21 = (ulong)(uint)((int)local_68 << 8) + 0xc10;
    pDVar16 = local_a8;
    local_50 = local_58;
    do {
      pTVar1 = local_108;
      pDStack_110 = (DisasContext_conflict1 *)0x6aff4a;
      local_f0 = pTVar6;
      pTVar6 = tcg_temp_new_internal_aarch64(local_108,TCG_TYPE_I32,false);
      pTVar24 = (TCGv_i32)((long)pTVar6 - (long)pTVar1);
      pDStack_110 = (DisasContext_conflict1 *)0x6aff5c;
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      lVar19 = (long)pTVar6 - (long)pTVar1;
      pDStack_110 = (DisasContext_conflict1 *)0x6aff6e;
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      pTVar14 = pDVar16->uc->tcg_ctx;
      pDStack_110 = (DisasContext_conflict1 *)0x6affa2;
      local_68 = TVar21;
      tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,(TCGArg)((long)pTVar14 + (long)pTVar24),
                          (TCGArg)(pTVar14->cpu_env + (long)pTVar14),TVar21);
      pTVar14 = pDVar16->uc->tcg_ctx;
      pDStack_110 = (DisasContext_conflict1 *)0x6affd3;
      local_60 = TVar12;
      tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,(long)pTVar14 + lVar19,
                          (TCGArg)(pTVar14->cpu_env + (long)pTVar14),TVar12);
      pTVar14 = local_108;
      if (0x1d < (uint)local_50) {
switchD_006afffe_caseD_6b0555:
        uVar23 = (ulong)local_6c;
        pDStack_110 = (DisasContext_conflict1 *)disas_simd_two_reg_misc_fp16;
        s_00 = local_a8;
        disas_simd_three_reg_same_fp16_cold_1();
        pTStack_118 = pTVar1;
        TStack_138 = TVar12;
        lStack_130 = lVar19;
        pTStack_128 = pTVar6;
        pTStack_120 = pTVar24;
        pDStack_110 = pDVar16;
        if ((s_00->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto LAB_006b072e;
        uVar7 = (uint)uVar23;
        uVar13 = uVar23 & 0xffffffff;
        pTVar14 = s_00->uc->tcg_ctx;
        uVar11 = (uint)(uVar23 >> 0x1d) & 1;
        uVar8 = (uint)(uVar23 >> 0x12) & 0x20 | (uint)(uVar23 >> 0xc) & 0x1f;
        iVar9 = uVar11 * 0x40;
        uVar22 = iVar9 + uVar8;
        rn = uVar7 & 0x1f;
        uVar15 = (uint)(uVar23 >> 5) & 0x1f;
        bVar4 = 1;
        iVar5 = 0xd78fc0;
        bVar2 = false;
        bVar3 = false;
        switch(uVar8 + iVar9) {
        case 0x18:
          iVar5 = 0;
          break;
        case 0x19:
          iVar5 = 2;
          break;
        case 0x1a:
switchD_006b05fb_caseD_1a:
          iVar5 = 0;
          bVar3 = true;
          bVar4 = 1;
          goto LAB_006b0693;
        case 0x1b:
switchD_006b05fb_caseD_1b:
          iVar5 = 2;
          goto LAB_006b069f;
        case 0x1c:
switchD_006b05fb_caseD_1c:
          iVar5 = 4;
          goto LAB_006b069f;
        case 0x1d:
switchD_006b05fb_caseD_1d:
          iVar5 = 1;
          if ((uVar23 & 0x10000000) == 0) {
            iVar5 = ((uint)(uVar13 >> 0x1c) & 4) + 4;
          }
          if (s_00->fp_access_checked == true) goto LAB_006b0db0;
          s_00->fp_access_checked = true;
          target_el = s_00->fp_excp_el;
          if (target_el == 0) {
            handle_simd_intfp_conv(s_00,rn,uVar15,iVar5,uVar11 ^ 1,0,1);
            return;
          }
          pc = s_00->pc_curr;
          goto LAB_006b077b;
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x21:
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x3c:
        case 0x3e:
          goto switchD_006b05fb_caseD_1e;
        case 0x2c:
        case 0x2d:
        case 0x2e:
switchD_006b05fb_caseD_2c:
          handle_2misc_fcmp_zero
                    (s_00,uVar22,(_Bool)((byte)(uVar23 >> 0x18) >> 4 & 1),
                     (_Bool)((byte)(uVar13 >> 0x1e) & 1),true,uVar15,rn,in_stack_fffffffffffffe48);
          return;
        case 0x2f:
switchD_006b05fb_caseD_2f:
          bVar3 = false;
          bVar4 = 0;
LAB_006b0693:
          bVar2 = false;
          goto switchD_006b05fb_caseD_3d;
        case 0x38:
          iVar5 = 1;
          break;
        case 0x39:
          iVar5 = 3;
          break;
        case 0x3a:
switchD_006b05fb_caseD_3a:
          iVar5 = 1;
          goto LAB_006b069f;
        case 0x3b:
switchD_006b05fb_caseD_3b:
          iVar5 = 3;
LAB_006b069f:
          bVar3 = true;
          bVar2 = false;
          bVar4 = 1;
        case 0x3d:
        case 0x3f:
          goto switchD_006b05fb_caseD_3d;
        default:
          iVar5 = 0xd79078;
          bVar2 = false;
          bVar3 = false;
          switch(uVar22) {
          case 0x6c:
          case 0x6d:
            goto switchD_006b05fb_caseD_2c;
          case 0x6f:
            goto switchD_006b05fb_caseD_2f;
          case 0x79:
switchD_006b061d_caseD_79:
            bVar3 = false;
            goto LAB_006b071c;
          case 0x7a:
            goto switchD_006b05fb_caseD_3a;
          case 0x7b:
            goto switchD_006b05fb_caseD_3b;
          case 0x7d:
          case 0x7f:
            goto switchD_006b05fb_caseD_3d;
          default:
            iVar5 = iVar9;
            switch(uVar22) {
            case 0x58:
              iVar5 = 4;
              goto LAB_006b0717;
            case 0x59:
              goto switchD_006b061d_caseD_79;
            case 0x5a:
              goto switchD_006b05fb_caseD_1a;
            case 0x5b:
              goto switchD_006b05fb_caseD_1b;
            case 0x5c:
              goto switchD_006b05fb_caseD_1c;
            case 0x5d:
              goto switchD_006b05fb_caseD_1d;
            }
          case 0x6e:
          case 0x70:
          case 0x71:
          case 0x72:
          case 0x73:
          case 0x74:
          case 0x75:
          case 0x76:
          case 0x77:
          case 0x78:
          case 0x7c:
          case 0x7e:
switchD_006b05fb_caseD_1e:
            disas_simd_two_reg_misc_fp16_cold_1();
          }
          goto LAB_006b0dec;
        }
LAB_006b0717:
        bVar3 = true;
LAB_006b071c:
        bVar4 = 1;
        bVar2 = true;
switchD_006b05fb_caseD_3d:
        if (((uVar7 >> 0x1c & 1) != 0) && (((uVar7 >> 0x1e & 1) == 0 || (bVar2)))) {
LAB_006b072e:
          unallocated_encoding_aarch64(s_00);
          return;
        }
        if (s_00->fp_access_checked == true) {
LAB_006b0db0:
          __assert_fail("!s->fp_access_checked",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x487,"_Bool fp_access_check(DisasContext *)");
        }
        s_00->fp_access_checked = true;
        target_el = s_00->fp_excp_el;
        if (target_el != 0) {
          pc = s_00->pc_curr;
LAB_006b077b:
          gen_exception_insn(s_00,pc,1,0x1fe0000a,target_el);
          return;
        }
        pTStack_198 = pTVar14;
        TStack_180 = (ulong)uVar15;
        if ((bool)(bVar4 | bVar3)) {
          lStack_1a0 = CONCAT44(lStack_1a0._4_4_,iVar5);
          pTVar6 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I64,false);
          pTStack_188 = (TCGv_i64)((long)pTVar6 - (long)pTVar14);
          tcg_gen_addi_i64_aarch64(pTVar14,pTStack_188,(TCGv_i64)pTVar14->cpu_env,0x2ed0);
          iVar5 = (int)lStack_1a0;
        }
        else {
          pTStack_188 = (TCGv_i64)0x0;
        }
        if (bVar3) {
          iVar5 = arm_rmode_to_sf_aarch64(iVar5);
          pTVar14 = pTStack_198;
          pTStack_160 = tcg_const_i32_aarch64(pTStack_198,iVar5);
          pTStack_1b0 = (TCGTemp *)(pTStack_160 + (long)pTVar14);
          pTStack_1a8 = pTStack_188 + (long)pTVar14;
          tcg_gen_callN_aarch64(pTVar14,helper_set_rmode_aarch64,pTStack_1b0,2,&pTStack_1b0);
        }
        else {
          pTStack_160 = (TCGv_i32)0x0;
        }
        pDStack_158 = s_00;
        if ((uVar7 >> 0x1c & 1) == 0) {
          lVar19 = (ulong)((uint)(uVar13 >> 0x1c) & 4) + 4;
          pTStack_190 = pTStack_188 + (long)pTStack_198;
          TVar21 = (TCGArg)(rn * 0x100 + 0xc10);
          TVar12 = (ulong)(uint)((int)TStack_180 << 8) + 0xc10;
          uStack_140 = (ulong)uVar22;
          uStack_148 = (ulong)(uVar22 - 0x2f);
          uStack_164 = uVar22 - 0x1a;
          uStack_16c = uVar22 - 0x18;
          uStack_168 = uVar22 - 0x5a;
          uStack_150 = (ulong)(uVar22 - 0x79);
          pTVar14 = pTStack_198;
          uStack_174 = uVar7;
          uStack_170 = rn;
          goto LAB_006b093c;
        }
        pTVar24 = read_fp_hreg((DisasContext_conflict1 *)s_00->uc->tcg_ctx,(int)TStack_180);
        pTVar14 = pTStack_198;
        pTVar6 = tcg_temp_new_internal_aarch64(pTStack_198,TCG_TYPE_I32,false);
        pTVar18 = pTStack_188;
        pTVar20 = (TCGv_i32)((long)pTVar6 - (long)pTVar14);
        uVar23 = (ulong)uVar22;
        if ((ushort)uVar22 < 0x40) {
          if ((0xc0000001c000000U >> (uVar23 & 0x3f) & 1) == 0) {
            if (uVar23 == 0x3d) {
              pcVar17 = helper_recpe_f16_aarch64;
            }
            else {
              if (uVar23 != 0x3f) goto LAB_006b0c52;
              pcVar17 = helper_frecpx_f16_aarch64;
            }
          }
          else {
            pcVar17 = helper_advsimd_f16tosinth_aarch64;
          }
          goto LAB_006b0c91;
        }
LAB_006b0c52:
        uVar23 = (ulong)(uVar22 - 0x5a);
        if (0x23 < uVar22 - 0x5a) {
LAB_006b0dec:
          iVar5 = 0x3339;
          goto LAB_006b0ddb;
        }
        if ((0x300000007U >> (uVar23 & 0x3f) & 1) == 0) {
          if (uVar23 != 0x15) {
            if (uVar23 != 0x23) goto LAB_006b0dec;
            pcVar17 = helper_rsqrte_f16_aarch64;
            goto LAB_006b0c91;
          }
          tcg_gen_xori_i32_aarch64(pTVar14,pTVar20,pTVar24,0x8000);
        }
        else {
          pcVar17 = helper_advsimd_f16touinth_aarch64;
LAB_006b0c91:
          pTStack_1a8 = pTStack_188 + (long)&pTVar14->pool_cur;
          pTStack_1b0 = (TCGTemp *)(pTVar24 + (long)&pTVar14->pool_cur);
          tcg_gen_callN_aarch64
                    (pTVar14,pcVar17,(TCGTemp *)((long)pTVar14 + (long)pTVar20),2,&pTStack_1b0);
        }
        tcg_gen_andi_i32_aarch64(pTVar14,pTVar20,pTVar20,0xffff);
        write_fp_sreg(pDStack_158,rn,pTVar20);
        tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar20 + (long)pTVar14));
        tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar24 + (long)pTVar14));
        goto LAB_006b0cdc;
      }
      pTVar6 = (TCGTemp *)((long)pTVar6 - (long)local_108);
      switch((long)&switchD_006afffe::switchdataD_00d78f28 +
             (long)(int)(&switchD_006afffe::switchdataD_00d78f28)[local_58]) {
      case 0x6b0000:
        pcVar17 = helper_advsimd_maxnumh_aarch64;
        break;
      case 0x6b0033:
        pcVar17 = helper_rsqrtsf_f16_aarch64;
        break;
      case 0x6b0066:
        pcVar17 = helper_advsimd_subh_aarch64;
        break;
      case 0x6b0099:
        pcVar17 = helper_advsimd_mulh_aarch64;
        break;
      case 0x6b00cc:
        pcVar17 = helper_advsimd_minh_aarch64;
        break;
      case 0x6b00ff:
        pDStack_110 = (DisasContext_conflict1 *)0x6b0116;
        tcg_gen_xori_i32_aarch64(local_108,pTVar24,pTVar24,0x8000);
        pTVar1 = local_a8->uc->tcg_ctx;
        pDStack_110 = (DisasContext_conflict1 *)0x6b0146;
        tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld16u_i32,(long)pTVar1 + (long)pTVar6,
                            (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(TCGArg)local_f8);
LAB_006b039f:
        pTVar10 = (TCGTemp *)((long)pTVar14 + (long)pTVar6);
        local_d0 = local_100;
        pcVar17 = helper_advsimd_muladdh_aarch64;
        iVar5 = 4;
        local_d8 = pTVar10;
        goto LAB_006b0438;
      case 0x6b014b:
        pcVar17 = helper_advsimd_cge_f16_aarch64;
        break;
      case 0x6b017e:
        pcVar17 = helper_advsimd_cgt_f16_aarch64;
        break;
      case 0x6b01b1:
        pcVar17 = helper_advsimd_acge_f16_aarch64;
        break;
      case 0x6b01e4:
        local_e8 = (TCGTemp *)((long)local_108 + (long)pTVar24);
        local_e0 = (long)local_108 + lVar19;
        local_d8 = local_100;
        pDStack_110 = (DisasContext_conflict1 *)0x6b0221;
        tcg_gen_callN_aarch64
                  (local_108,helper_advsimd_subh_aarch64,(TCGTemp *)((long)local_108 + (long)pTVar6)
                   ,3,&local_e8);
        pDStack_110 = (DisasContext_conflict1 *)0x6b0234;
        tcg_gen_andi_i32_aarch64(pTVar14,(TCGv_i32)pTVar6,(TCGv_i32)pTVar6,0x7fff);
        goto LAB_006b0442;
      case 0x6b0239:
        pcVar17 = helper_advsimd_ceq_f16_aarch64;
        break;
      case 0x6b026c:
        pcVar17 = helper_advsimd_divh_aarch64;
        break;
      case 0x6b029f:
        pcVar17 = helper_advsimd_maxh_aarch64;
        break;
      case 0x6b02d2:
        pcVar17 = helper_advsimd_addh_aarch64;
        break;
      case 0x6b0305:
        pcVar17 = helper_advsimd_minnumh_aarch64;
        break;
      case 0x6b0338:
        pcVar17 = helper_advsimd_mulxh_aarch64;
        break;
      case 0x6b036b:
        pTVar14 = local_a8->uc->tcg_ctx;
        pDStack_110 = (DisasContext_conflict1 *)0x6b039b;
        tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,(long)pTVar14 + (long)pTVar6,
                            (TCGArg)(pTVar14->cpu_env + (long)pTVar14),(TCGArg)local_f8);
        pTVar14 = local_108;
        goto LAB_006b039f;
      case 0x6b03d5:
        pcVar17 = helper_recpsf_f16_aarch64;
        break;
      case 0x6b0405:
        pcVar17 = helper_advsimd_acgt_f16_aarch64;
        break;
      case 0x6b0555:
        goto switchD_006afffe_caseD_6b0555;
      }
      local_d8 = local_100;
      pTVar10 = (TCGTemp *)((long)local_108 + (long)pTVar6);
      iVar5 = 3;
LAB_006b0438:
      local_e0 = (long)pTVar14 + lVar19;
      local_e8 = (TCGTemp *)((long)pTVar14 + (long)pTVar24);
      pDStack_110 = (DisasContext_conflict1 *)0x6b0442;
      tcg_gen_callN_aarch64(pTVar14,pcVar17,pTVar10,iVar5,&local_e8);
LAB_006b0442:
      pDVar16 = local_a8;
      pTVar10 = local_f8;
      pTVar1 = local_a8->uc->tcg_ctx;
      pDStack_110 = (DisasContext_conflict1 *)0x6b047b;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st16_i32,(long)pTVar1 + (long)pTVar6,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(TCGArg)local_f8);
      pDStack_110 = (DisasContext_conflict1 *)0x6b0489;
      tcg_temp_free_internal_aarch64
                (pTVar14,(TCGTemp *)((long)&pTVar14->pool_cur + (long)&pTVar6->field_0x0));
      pDStack_110 = (DisasContext_conflict1 *)0x6b0497;
      tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar24 + (long)pTVar14));
      pDStack_110 = (DisasContext_conflict1 *)0x6b04a5;
      tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(lVar19 + (long)pTVar14));
      TVar12 = local_60 + 2;
      TVar21 = local_68 + 2;
      local_f8 = (TCGTemp *)((long)pTVar10 + 2);
      pTVar6 = (TCGTemp *)((long)&local_f0[-1].state_ptr + 7);
    } while (pTVar6 != (TCGTemp *)0x0);
  }
  else {
    pDStack_110 = (DisasContext_conflict1 *)0x6afbd8;
    local_f8 = tcg_temp_new_internal_aarch64(local_108,TCG_TYPE_I32,false);
    local_100 = (TCGTemp *)((long)local_f8 - (long)pTVar14);
    pDStack_110 = (DisasContext_conflict1 *)0x6afbf1;
    local_f0 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I32,false);
    uVar11 = local_48;
    local_50 = (long)local_f0 - (long)pTVar14;
    local_58 = (ulong)(uVar7 >> 1);
    local_80 = (TCGv_i64)((long)pTVar14 + (long)pTVar18);
    local_78 = (ulong)uVar7;
    local_44 = uVar22 + 2 + uVar7;
    local_38 = (ulong)local_48;
    uVar23 = 0;
    do {
      pDVar16 = local_a8;
      iVar5 = (int)local_60;
      if (uVar23 < local_58) {
        iVar5 = (int)local_68;
      }
      pTVar14 = local_a8->uc->tcg_ctx;
      uVar7 = uVar8 & local_44;
      pDStack_110 = (DisasContext_conflict1 *)0x6afcad;
      tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,
                          (TCGArg)(&local_100->field_0x0 + (long)&pTVar14->pool_cur),
                          (TCGArg)(pTVar14->cpu_env + (long)pTVar14),
                          (ulong)(iVar5 * 0x100 + uVar7 + 0xc10));
      pTVar14 = pDVar16->uc->tcg_ctx;
      pDStack_110 = (DisasContext_conflict1 *)0x6afce9;
      tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,(long)&pTVar14->pool_cur + local_50,
                          (TCGArg)(pTVar14->cpu_env + (long)pTVar14),
                          (ulong)(iVar5 * 0x100 + uVar7 + 0xc12));
      pTVar14 = local_108;
      pDStack_110 = (DisasContext_conflict1 *)0x6afcf9;
      pTVar6 = tcg_temp_new_internal_aarch64(local_108,TCG_TYPE_I32,false);
      (&local_e8)[uVar23] = (TCGTemp *)((long)pTVar6 - (long)pTVar14);
      if (7 < uVar11) {
switchD_006afd20_caseD_6b0523:
        pDStack_110 = (DisasContext_conflict1 *)0x6b0536;
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2e6e,(char *)0x0);
      }
      switch((long)&switchD_006afd20::switchdataD_00d78fa0 +
             (long)(int)(&switchD_006afd20::switchdataD_00d78fa0)[local_38]) {
      case 0x6afd22:
        pcVar17 = helper_advsimd_maxnumh_aarch64;
        break;
      case 0x6afd59:
        pcVar17 = helper_advsimd_minh_aarch64;
        break;
      case 0x6afd90:
        pcVar17 = helper_advsimd_maxh_aarch64;
        break;
      case 0x6afdc4:
        pcVar17 = helper_advsimd_minnumh_aarch64;
        break;
      case 0x6afdf8:
        pcVar17 = helper_advsimd_addh_aarch64;
        break;
      case 0x6b0523:
        goto switchD_006afd20_caseD_6b0523;
      }
      local_88 = local_80;
      local_90 = local_f0;
      local_98 = local_f8;
      pDStack_110 = (DisasContext_conflict1 *)0x6afe3c;
      tcg_gen_callN_aarch64
                (local_108,pcVar17,
                 (TCGTemp *)
                 ((long)&local_108->pool_cur +
                 (long)&((TCGTemp *)((long)pTVar6 - (long)pTVar14))->field_0x0),3,&local_98);
      uVar13 = local_78;
      pDVar16 = local_a8;
      uVar23 = uVar23 + 1;
      uVar8 = uVar8 + 4;
    } while (local_78 != uVar23);
    TVar12 = (TCGArg)(local_9c * 0x100 + 0xc10);
    uVar23 = 0;
    do {
      pTVar6 = (&local_e8)[uVar23];
      pTVar14 = pDVar16->uc->tcg_ctx;
      pDStack_110 = (DisasContext_conflict1 *)0x6afe9c;
      tcg_gen_op3_aarch64(pTVar14,INDEX_op_st16_i32,(long)&pTVar14->pool_cur + (long)pTVar6,
                          (TCGArg)(pTVar14->cpu_env + (long)pTVar14),TVar12);
      pDStack_110 = (DisasContext_conflict1 *)0x6afeab;
      tcg_temp_free_internal_aarch64
                (local_108,(TCGTemp *)((long)&local_108->pool_cur + (long)pTVar6));
      pTVar14 = local_108;
      uVar23 = uVar23 + 1;
      TVar12 = TVar12 + 2;
    } while (uVar13 != uVar23);
    pDStack_110 = (DisasContext_conflict1 *)0x6afec8;
    tcg_temp_free_internal_aarch64(local_108,local_f8);
    pDStack_110 = (DisasContext_conflict1 *)0x6afed5;
    tcg_temp_free_internal_aarch64(pTVar14,local_f0);
  }
  uVar8 = local_6c >> 0x1e;
  pDStack_110 = (DisasContext_conflict1 *)0x6b04f5;
  tcg_temp_free_internal_aarch64(local_108,(TCGTemp *)(local_40 + (long)local_108));
  pDStack_110 = (DisasContext_conflict1 *)0x6b0511;
  clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)pDVar16->sve_len,
                 SUB81(pDVar16->uc->tcg_ctx,0),uVar8 & 1);
  return;
LAB_006b093c:
  lStack_1a0 = lVar19;
  pTVar6 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I32,false);
  pTVar24 = (TCGv_i32)((long)pTVar6 - (long)pTVar14);
  pTVar6 = tcg_temp_new_internal_aarch64(pTVar14,TCG_TYPE_I32,false);
  pTVar20 = (TCGv_i32)((long)pTVar6 - (long)pTVar14);
  pTVar14 = s_00->uc->tcg_ctx;
  TStack_180 = TVar12;
  tcg_gen_op3_aarch64(pTVar14,INDEX_op_ld16u_i32,(TCGArg)((long)pTVar14 + (long)pTVar24),
                      (TCGArg)(pTVar14->cpu_env + (long)pTVar14),TVar12);
  pTVar14 = pTStack_198;
  iVar5 = (int)uStack_140;
  if (iVar5 < 0x58) {
    if ((uint)uStack_148 < 0xf) {
      (*(code *)(&DAT_00d790c8 + *(int *)(&DAT_00d790c8 + uStack_148 * 4)))();
      return;
    }
    if (uStack_164 < 3) {
      pcVar17 = helper_advsimd_f16tosinth_aarch64;
    }
    else {
      if (1 < uStack_16c) {
LAB_006b0dcf:
        iVar5 = 0x3373;
LAB_006b0ddb:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,iVar5,(char *)0x0);
      }
LAB_006b0ac7:
      pcVar17 = helper_advsimd_rinth_aarch64;
    }
LAB_006b0ae8:
    pTStack_1b0 = (TCGTemp *)((long)pTStack_198 + (long)pTVar24);
    pTStack_1a8 = pTStack_190;
    tcg_gen_callN_aarch64
              (pTStack_198,pcVar17,(TCGTemp *)((long)pTStack_198 + (long)pTVar20),2,&pTStack_1b0);
  }
  else {
    if (iVar5 < 0x6f) {
      if (uStack_168 < 3) {
        pcVar17 = helper_advsimd_f16touinth_aarch64;
      }
      else {
        if (iVar5 == 0x58) goto LAB_006b0ac7;
        if (iVar5 != 0x59) goto LAB_006b0dcf;
        pcVar17 = helper_advsimd_rinth_exact_aarch64;
      }
      goto LAB_006b0ae8;
    }
    if ((uint)uStack_150 < 7) {
      (*(code *)(&DAT_00d79104 + *(int *)(&DAT_00d79104 + uStack_150 * 4)))();
      return;
    }
    if (iVar5 != 0x6f) goto LAB_006b0dcf;
    tcg_gen_xori_i32_aarch64(pTStack_198,pTVar20,pTVar24,0x8000);
  }
  s_00 = pDStack_158;
  lVar19 = lStack_1a0;
  pTVar1 = pDStack_158->uc->tcg_ctx;
  tcg_gen_op3_aarch64(pTVar1,INDEX_op_st16_i32,(TCGArg)((long)pTVar1 + (long)pTVar20),
                      (TCGArg)(pTVar1->cpu_env + (long)pTVar1),TVar21);
  tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar20 + (long)pTVar14));
  tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar24 + (long)pTVar14));
  TVar12 = TStack_180 + 2;
  TVar21 = TVar21 + 2;
  lVar19 = lVar19 + -1;
  if (lVar19 == 0) {
    clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)s_00->sve_len,SUB81(s_00->uc->tcg_ctx,0),
                   uStack_174 >> 0x1e & 1);
    pTVar18 = pTStack_188;
LAB_006b0cdc:
    if (pTStack_160 != (TCGv_i32)0x0) {
      pTVar6 = (TCGTemp *)(pTStack_160 + (long)pTVar14);
      pTStack_1a8 = pTVar18 + (long)&pTVar14->pool_cur;
      pTStack_1b0 = pTVar6;
      tcg_gen_callN_aarch64(pTVar14,helper_set_rmode_aarch64,pTVar6,2,&pTStack_1b0);
      tcg_temp_free_internal_aarch64(pTVar14,pTVar6);
    }
    if (pTVar18 != (TCGv_i64)0x0) {
      tcg_temp_free_internal_aarch64(pTVar14,(TCGTemp *)(pTVar18 + (long)pTVar14));
    }
    return;
  }
  goto LAB_006b093c;
}

Assistant:

static void disas_simd_three_reg_same_fp16(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode, fpopcode;
    int is_q, u, a, rm, rn, rd;
    int datasize, elements;
    int pass;
    TCGv_ptr fpst;
    bool pairwise = false;

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* For these floating point ops, the U, a and opcode bits
     * together indicate the operation.
     */
    opcode = extract32(insn, 11, 3);
    u = extract32(insn, 29, 1);
    a = extract32(insn, 23, 1);
    is_q = extract32(insn, 30, 1);
    rm = extract32(insn, 16, 5);
    rn = extract32(insn, 5, 5);
    rd = extract32(insn, 0, 5);

    fpopcode = opcode | (a << 3) |  (u << 4);
    datasize = is_q ? 128 : 64;
    elements = datasize / 16;

    switch (fpopcode) {
    case 0x10: /* FMAXNMP */
    case 0x12: /* FADDP */
    case 0x16: /* FMAXP */
    case 0x18: /* FMINNMP */
    case 0x1e: /* FMINP */
        pairwise = true;
        break;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    if (pairwise) {
        int maxpass = is_q ? 8 : 4;
        TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res[8];

        for (pass = 0; pass < maxpass; pass++) {
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (pass << 1) & (maxpass - 1);

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_16);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_16);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (fpopcode) {
            case 0x10: /* FMAXNMP */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x12: /* FADDP */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x16: /* FMAXP */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x18: /* FMINNMP */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x1e: /* FMINP */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_op1);
        tcg_temp_free_i32(tcg_ctx, tcg_op2);

    } else {
        for (pass = 0; pass < elements; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op1, rn, pass, MO_16);
            read_vec_element_i32(s, tcg_op2, rm, pass, MO_16);

            switch (fpopcode) {
            case 0x0: /* FMAXNM */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0x2: /* FADD */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x3: /* FMULX */
                gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x4: /* FCMEQ */
                gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x6: /* FMAX */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x7: /* FRECPS */
                gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x8: /* FMINNM */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x9: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                tcg_gen_xori_i32(tcg_ctx, tcg_op1, tcg_op1, 0x8000);
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0xa: /* FSUB */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xe: /* FMIN */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xf: /* FRSQRTS */
                gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x13: /* FMUL */
                gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x14: /* FCMGE */
                gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x15: /* FACGE */
                gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x17: /* FDIV */
                gen_helper_advsimd_divh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1a: /* FABD */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
                break;
            case 0x1c: /* FCMGT */
                gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1d: /* FACGT */
                gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            default:
                fprintf(stderr, "%s: insn %#04x, fpop %#2x @ %#" PRIx64 "\n",
                        __func__, insn, fpopcode, s->pc_curr);
                g_assert_not_reached();
            }

            write_vec_element_i32(s, tcg_res, rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    clear_vec_high(s, is_q, rd);
}